

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase28::run(TestCase28 *this)

{
  int iVar1;
  int local_68;
  bool local_61;
  int local_60;
  int iStack_5c;
  bool _kj_shouldLog_3;
  bool local_55;
  int local_54;
  int iStack_50;
  bool _kj_shouldLog_2;
  bool local_49;
  int local_48;
  int iStack_44;
  bool _kj_shouldLog_1;
  bool local_3d;
  bool _kj_shouldLog;
  Type local_30;
  undefined1 local_28 [8];
  Function<int_(int,_int)> f;
  int i;
  TestCase28 *this_local;
  
  f.impl.ptr._4_4_ = 0;
  local_30.i = (int *)((long)&f.impl.ptr + 4);
  Function<int(int,int)>::Function<kj::(anonymous_namespace)::TestCase28::run()::__0>
            ((Function<int(int,int)> *)local_28,&local_30);
  iVar1 = Function<int_(int,_int)>::operator()((Function<int_(int,_int)> *)local_28,0x7b,0x1c8);
  if (iVar1 != 0x243) {
    local_3d = _::Debug::shouldLog(ERROR);
    while (local_3d != false) {
      iStack_44 = 0x243;
      local_48 = Function<int_(int,_int)>::operator()
                           ((Function<int_(int,_int)> *)local_28,0x7b,0x1c8);
      _::Debug::log<char_const(&)[46],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x21,ERROR,
                 "\"failed: expected \" \"(123 + 456) == (f(123, 456))\", 123 + 456, f(123, 456)",
                 (char (*) [46])"failed: expected (123 + 456) == (f(123, 456))",
                 &stack0xffffffffffffffbc,&local_48);
      local_3d = false;
    }
  }
  iVar1 = Function<int_(int,_int)>::operator()((Function<int_(int,_int)> *)local_28,7,8);
  if (iVar1 != 0x10) {
    local_49 = _::Debug::shouldLog(ERROR);
    while (local_49 != false) {
      iStack_50 = 0x10;
      local_54 = Function<int_(int,_int)>::operator()((Function<int_(int,_int)> *)local_28,7,8);
      _::Debug::log<char_const(&)[42],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x22,ERROR,
                 "\"failed: expected \" \"(7 + 8 + 1) == (f(7, 8))\", 7 + 8 + 1, f(7, 8)",
                 (char (*) [42])"failed: expected (7 + 8 + 1) == (f(7, 8))",&stack0xffffffffffffffb0
                 ,&local_54);
      local_49 = false;
    }
  }
  iVar1 = Function<int_(int,_int)>::operator()((Function<int_(int,_int)> *)local_28,2,9);
  if (iVar1 != 0xd) {
    local_55 = _::Debug::shouldLog(ERROR);
    while (local_55 != false) {
      iStack_5c = 0xd;
      local_60 = Function<int_(int,_int)>::operator()((Function<int_(int,_int)> *)local_28,2,9);
      _::Debug::log<char_const(&)[42],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x23,ERROR,
                 "\"failed: expected \" \"(9 + 2 + 2) == (f(2, 9))\", 9 + 2 + 2, f(2, 9)",
                 (char (*) [42])"failed: expected (9 + 2 + 2) == (f(2, 9))",&stack0xffffffffffffffa4
                 ,&local_60);
      local_55 = false;
    }
  }
  if (f.impl.ptr._4_4_ != 3) {
    local_61 = _::Debug::shouldLog(ERROR);
    while (local_61 != false) {
      local_68 = 3;
      _::Debug::log<char_const(&)[28],int&,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x25,ERROR,"\"failed: expected \" \"(i) == (3)\", i, 3",
                 (char (*) [28])"failed: expected (i) == (3)",(int *)((long)&f.impl.ptr + 4),
                 &local_68);
      local_61 = false;
    }
  }
  Function<int_(int,_int)>::~Function((Function<int_(int,_int)> *)local_28);
  return;
}

Assistant:

TEST(Function, Lambda) {
  int i = 0;

  Function<int(int, int)> f = [&](int a, int b) { return a + b + i++; };

  EXPECT_EQ(123 + 456, f(123, 456));
  EXPECT_EQ(7 + 8 + 1, f(7, 8));
  EXPECT_EQ(9 + 2 + 2, f(2, 9));

  EXPECT_EQ(i, 3);
}